

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterSystem.cpp
# Opt level: O2

uint8_t __thiscall
Sega::MasterSystem::ConcreteMachine<(Analyser::Static::Sega::Target::Model)2>::get_th_values
          (ConcreteMachine<(Analyser::Static::Sega::Target::Model)2> *this)

{
  byte bVar1;
  
  bVar1 = this->io_port_control_;
  return (bVar1 << 4 | bVar1) & 0x80 | (bVar1 * '\x02' | bVar1 << 5) & 0x40;
}

Assistant:

inline uint8_t get_th_values() {
			// Quick not on TH inputs here: if either is setup as an output, then the
			// currently output level is returned. Otherwise they're fixed at 1.
			return
				uint8_t(
					((io_port_control_ & 0x02) << 5) | ((io_port_control_&0x20) << 1) |
					((io_port_control_ & 0x08) << 4) | (io_port_control_&0x80)
				);

		}